

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::xtToName(Forth *this)

{
  uint index;
  Definition *pDVar1;
  Definition *pDVar2;
  size_t sVar3;
  size_type sVar4;
  size_t dataInDataSpace_;
  string *name;
  Xt xt;
  Forth *this_local;
  
  requireDStackDepth(this,1,"XT>NAME");
  requireDStackAvailable(this,1,"XT>NAME");
  index = ForthStack<unsigned_int>::getTop(&this->dStack);
  pDVar1 = definitionsAt(this,index);
  pDVar2 = definitionsAt(this,index);
  sVar3 = PutStringToEndOfDataSpace(this,&pDVar2->name);
  ForthStack<unsigned_int>::setTop(&this->dStack,(uint)sVar3);
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    (&pDVar1->name);
  push(this,(Cell)sVar4);
  return;
}

Assistant:

void xtToName() {
			REQUIRE_DSTACK_DEPTH(1, "XT>NAME");
			REQUIRE_DSTACK_AVAILABLE(1, "XT>NAME");
			auto xt = XT(dStack.getTop());
			auto& name = definitionsAt(xt).name;
			auto dataInDataSpace_ = PutStringToEndOfDataSpace(definitionsAt(xt).name);
			dStack.setTop(CELL(dataInDataSpace_));
			push(static_cast<Cell>(name.length()));
		}